

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubdirectoryDisposer.cpp
# Opt level: O3

void __thiscall
ApprovalTests::SubdirectoryDisposer::SubdirectoryDisposer
          (SubdirectoryDisposer *this,string *subdirectory)

{
  string *this_00;
  
  (this->previous_result)._M_dataplus._M_p = (pointer)&(this->previous_result).field_2;
  (this->previous_result)._M_string_length = 0;
  (this->previous_result).field_2._M_local_buf[0] = '\0';
  ApprovalTestNamer::testConfiguration();
  ::std::__cxx11::string::_M_assign((string *)this);
  this_00 = (string *)ApprovalTestNamer::testConfiguration();
  ::std::__cxx11::string::operator=(this_00,(string *)subdirectory);
  return;
}

Assistant:

SubdirectoryDisposer::SubdirectoryDisposer(std::string subdirectory)
    {
        previous_result = ApprovalTestNamer::testConfiguration().subdirectory;
        ApprovalTestNamer::testConfiguration().subdirectory = std::move(subdirectory);
    }